

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  uint uVar5;
  int in_R8D;
  
  iVar2 = *(int *)&ctxt->input->cur;
  iVar3 = *(int *)&ctxt->input->base;
  while( true ) {
    uVar5 = htmlParseLookupSequence(ctxt,'-','-','\0',in_R8D);
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    pxVar4 = ctxt->input->cur;
    xVar1 = pxVar4[(ulong)uVar5 + 2];
    if (xVar1 == '!') {
      xVar1 = pxVar4[(ulong)uVar5 + 3];
    }
    if (xVar1 == '>') break;
    ctxt->checkIndex = (long)(int)(uVar5 + (iVar2 - iVar3) + 1);
  }
  return uVar5;
}

Assistant:

static int
htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)
{
    int mark = 0;
    int cur = CUR_PTR - BASE_PTR;

    while (mark >= 0) {
	mark = htmlParseLookupSequence(ctxt, '-', '-', 0, 0);
	if ((mark < 0) ||
	    (NXT(mark+2) == '>') ||
	    ((NXT(mark+2) == '!') && (NXT(mark+3) == '>'))) {
	    return mark;
	}
	ctxt->checkIndex = cur + mark + 1;
    }
    return mark;
}